

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O1

void __thiscall di::Context::addInstance<B>(Context *this,B *instance,bool takeOwnership)

{
  pointer *pppCVar1;
  iterator __position;
  mapped_type *pmVar2;
  runtime_error *prVar3;
  long *plVar4;
  type_info *ptVar5;
  key_type local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (instance == (B *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Trying to add nullptr instance for type: ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
    local_68._M_target = (type_info *)*plVar4;
    ptVar5 = (type_info *)(plVar4 + 2);
    if (local_68._M_target == ptVar5) {
      local_58 = *(long *)ptVar5;
      lStack_50 = plVar4[3];
      local_68._M_target = (type_info *)&local_58;
    }
    else {
      local_58 = *(long *)ptVar5;
    }
    local_60 = plVar4[1];
    *plVar4 = (long)ptVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(prVar3,(string *)&local_68);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68._M_target = (type_info *)&B::typeinfo;
  pmVar2 = std::
           map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
           ::operator[](&this->items,&local_68);
  if (pmVar2->instancePtr == (void *)0x0) {
    pmVar2->instancePtr = instance;
    if (takeOwnership) {
      pmVar2->deleter = addInstance<B>::anon_class_1_0_00000001::__invoke;
      __position._M_current =
           (this->constructionOrder).
           super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->constructionOrder).
          super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_68._M_target = (type_info *)pmVar2;
        std::vector<di::Context::CtxItem*,std::allocator<di::Context::CtxItem*>>::
        _M_realloc_insert<di::Context::CtxItem*>
                  ((vector<di::Context::CtxItem*,std::allocator<di::Context::CtxItem*>> *)
                   &this->constructionOrder,__position,(CtxItem **)&local_68);
      }
      else {
        *__position._M_current = pmVar2;
        pppCVar1 = &(this->constructionOrder).
                    super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Instance already in Context for type: ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
  local_68._M_target = (type_info *)*plVar4;
  ptVar5 = (type_info *)(plVar4 + 2);
  if (local_68._M_target == ptVar5) {
    local_58 = *(long *)ptVar5;
    lStack_50 = plVar4[3];
    local_68._M_target = (type_info *)&local_58;
  }
  else {
    local_58 = *(long *)ptVar5;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)ptVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_68);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addInstance(T* instance, bool takeOwnership = false)
    {
        if (instance == nullptr)
            throw std::runtime_error(std::string("Trying to add nullptr instance for type: ") + typeid(T).name());

        CtxItem& item = items[ std::type_index(typeid(T)) ];

        if (item.instancePtr != nullptr)
            throw std::runtime_error(std::string("Instance already in Context for type: ") + typeid(T).name());

        item.instancePtr = static_cast<void*>(instance);

        if (takeOwnership)
        {
            item.deleter = [](void* ptr) { delete( static_cast<T*>(ptr) ); };
            constructionOrder.push_back(&item);
        }
    }